

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void refs_free(refs_t *r)

{
  ref_entry *__ptr;
  int iVar1;
  ref_entry *e;
  khint_t k;
  refs_t *r_local;
  
  iVar1 = r->count + -1;
  r->count = iVar1;
  if ((iVar1 < 1) && (r != (refs_t *)0x0)) {
    if (r->pool != (string_alloc_t *)0x0) {
      string_pool_destroy(r->pool);
    }
    if (r->h_meta != (kh_refs_t *)0x0) {
      for (e._4_4_ = 0; e._4_4_ != r->h_meta->n_buckets; e._4_4_ = e._4_4_ + 1) {
        if (((r->h_meta->flags[e._4_4_ >> 4] >> (sbyte)((e._4_4_ & 0xf) << 1) & 3) == 0) &&
           (__ptr = r->h_meta->vals[e._4_4_], __ptr != (ref_entry *)0x0)) {
          if (__ptr->seq != (char *)0x0) {
            free(__ptr->seq);
          }
          free(__ptr);
        }
      }
      kh_destroy_refs(r->h_meta);
    }
    if (r->ref_id != (ref_entry **)0x0) {
      free(r->ref_id);
    }
    if (r->fp != (BGZF *)0x0) {
      bgzf_close(r->fp);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&r->lock);
    free(r);
  }
  return;
}

Assistant:

void refs_free(refs_t *r) {
    RP("refs_free()\n");

    if (--r->count > 0)
	return;

    if (!r)
	return;

    if (r->pool)
	string_pool_destroy(r->pool);

    if (r->h_meta) {
	khint_t k;

	for (k = kh_begin(r->h_meta); k != kh_end(r->h_meta); k++) {
	    ref_entry *e;

	    if (!kh_exist(r->h_meta, k))
		continue;
	    if (!(e = kh_val(r->h_meta, k)))
		continue;
	    if (e->seq)
		free(e->seq);
	    free(e);
	}

	kh_destroy(refs, r->h_meta);
    }
    
    if (r->ref_id)
	free(r->ref_id);

    if (r->fp)
	bgzf_close(r->fp);

    pthread_mutex_destroy(&r->lock);

    free(r);
}